

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  byte bVar5;
  long lVar6;
  OutPt *pOVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (btmPt1->pt).X;
  lVar2 = (btmPt1->pt).Y;
  pOVar7 = btmPt1;
  do {
    pOVar7 = pOVar7->prev;
    lVar3 = (pOVar7->pt).X;
    if ((pOVar7 == btmPt1) || (lVar3 != lVar1)) break;
  } while ((pOVar7->pt).Y == lVar2);
  lVar6 = (btmPt1->pt).Y;
  lVar8 = (pOVar7->pt).Y - lVar6;
  pOVar7 = btmPt1;
  if (lVar8 == 0) {
    dVar9 = -1e+40;
  }
  else {
    dVar9 = (double)(lVar3 - lVar1) / (double)lVar8;
  }
  do {
    pOVar7 = pOVar7->next;
    lVar3 = (pOVar7->pt).X;
    if ((pOVar7 == btmPt1) || (lVar3 != lVar1)) break;
  } while ((pOVar7->pt).Y == lVar2);
  lVar6 = (pOVar7->pt).Y - lVar6;
  if (lVar6 == 0) {
    dVar10 = -1e+40;
  }
  else {
    dVar10 = (double)(lVar3 - lVar1) / (double)lVar6;
  }
  lVar1 = (btmPt2->pt).X;
  lVar2 = (btmPt2->pt).Y;
  pOVar7 = btmPt2;
  do {
    pOVar7 = pOVar7->prev;
    lVar3 = (pOVar7->pt).X;
    if ((pOVar7 == btmPt2) || (lVar3 != lVar1)) break;
  } while ((pOVar7->pt).Y == lVar2);
  lVar6 = (btmPt2->pt).Y;
  lVar8 = (pOVar7->pt).Y - lVar6;
  pOVar7 = btmPt2;
  if (lVar8 == 0) {
    dVar4 = -1e+40;
  }
  else {
    dVar4 = (double)(lVar3 - lVar1) / (double)lVar8;
  }
  do {
    pOVar7 = pOVar7->next;
    lVar3 = (pOVar7->pt).X;
    if ((pOVar7 == btmPt2) || (lVar3 != lVar1)) break;
  } while ((pOVar7->pt).Y == lVar2);
  lVar6 = (pOVar7->pt).Y - lVar6;
  if (lVar6 == 0) {
    dVar11 = -1e+40;
  }
  else {
    dVar11 = (double)(lVar3 - lVar1) / (double)lVar6;
  }
  if ((ABS(dVar9) < ABS(dVar4)) || (bVar5 = 1, ABS(dVar9) < ABS(dVar11))) {
    bVar5 = -(ABS(dVar4) <= ABS(dVar10)) & -(ABS(dVar11) <= ABS(dVar10));
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->prev;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->prev;
  double dx1p = std::fabs(GetDx(btmPt1->pt, p->pt));
  p = btmPt1->next;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->next;
  double dx1n = std::fabs(GetDx(btmPt1->pt, p->pt));

  p = btmPt2->prev;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->prev;
  double dx2p = std::fabs(GetDx(btmPt2->pt, p->pt));
  p = btmPt2->next;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->next;
  double dx2n = std::fabs(GetDx(btmPt2->pt, p->pt));
  return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}